

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

TidyMessageImpl *
formatStandardDynamic
          (TidyDocImpl *doc,Node *element,Node *node,uint code,uint level,__va_list_tag *args)

{
  TidyReportLevel level_00;
  char acStack_138 [8];
  char nodedesc [256];
  __va_list_tag *args_local;
  uint level_local;
  uint code_local;
  Node *node_local;
  Node *element_local;
  TidyDocImpl *doc_local;
  
  nodedesc[0xe8] = '\0';
  nodedesc[0xe9] = '\0';
  nodedesc[0xea] = '\0';
  nodedesc[0xeb] = '\0';
  nodedesc[0xec] = '\0';
  nodedesc[0xed] = '\0';
  nodedesc[0xee] = '\0';
  nodedesc[0xef] = '\0';
  nodedesc[0xf0] = '\0';
  nodedesc[0xf1] = '\0';
  nodedesc[0xf2] = '\0';
  nodedesc[0xf3] = '\0';
  nodedesc[0xf4] = '\0';
  nodedesc[0xf5] = '\0';
  nodedesc[0xf6] = '\0';
  nodedesc[0xf7] = '\0';
  nodedesc[0xd8] = '\0';
  nodedesc[0xd9] = '\0';
  nodedesc[0xda] = '\0';
  nodedesc[0xdb] = '\0';
  nodedesc[0xdc] = '\0';
  nodedesc[0xdd] = '\0';
  nodedesc[0xde] = '\0';
  nodedesc[0xdf] = '\0';
  nodedesc[0xe0] = '\0';
  nodedesc[0xe1] = '\0';
  nodedesc[0xe2] = '\0';
  nodedesc[0xe3] = '\0';
  nodedesc[0xe4] = '\0';
  nodedesc[0xe5] = '\0';
  nodedesc[0xe6] = '\0';
  nodedesc[0xe7] = '\0';
  nodedesc[200] = '\0';
  nodedesc[0xc9] = '\0';
  nodedesc[0xca] = '\0';
  nodedesc[0xcb] = '\0';
  nodedesc[0xcc] = '\0';
  nodedesc[0xcd] = '\0';
  nodedesc[0xce] = '\0';
  nodedesc[0xcf] = '\0';
  nodedesc[0xd0] = '\0';
  nodedesc[0xd1] = '\0';
  nodedesc[0xd2] = '\0';
  nodedesc[0xd3] = '\0';
  nodedesc[0xd4] = '\0';
  nodedesc[0xd5] = '\0';
  nodedesc[0xd6] = '\0';
  nodedesc[0xd7] = '\0';
  nodedesc[0xb8] = '\0';
  nodedesc[0xb9] = '\0';
  nodedesc[0xba] = '\0';
  nodedesc[0xbb] = '\0';
  nodedesc[0xbc] = '\0';
  nodedesc[0xbd] = '\0';
  nodedesc[0xbe] = '\0';
  nodedesc[0xbf] = '\0';
  nodedesc[0xc0] = '\0';
  nodedesc[0xc1] = '\0';
  nodedesc[0xc2] = '\0';
  nodedesc[0xc3] = '\0';
  nodedesc[0xc4] = '\0';
  nodedesc[0xc5] = '\0';
  nodedesc[0xc6] = '\0';
  nodedesc[199] = '\0';
  nodedesc[0xa8] = '\0';
  nodedesc[0xa9] = '\0';
  nodedesc[0xaa] = '\0';
  nodedesc[0xab] = '\0';
  nodedesc[0xac] = '\0';
  nodedesc[0xad] = '\0';
  nodedesc[0xae] = '\0';
  nodedesc[0xaf] = '\0';
  nodedesc[0xb0] = '\0';
  nodedesc[0xb1] = '\0';
  nodedesc[0xb2] = '\0';
  nodedesc[0xb3] = '\0';
  nodedesc[0xb4] = '\0';
  nodedesc[0xb5] = '\0';
  nodedesc[0xb6] = '\0';
  nodedesc[0xb7] = '\0';
  nodedesc[0x98] = '\0';
  nodedesc[0x99] = '\0';
  nodedesc[0x9a] = '\0';
  nodedesc[0x9b] = '\0';
  nodedesc[0x9c] = '\0';
  nodedesc[0x9d] = '\0';
  nodedesc[0x9e] = '\0';
  nodedesc[0x9f] = '\0';
  nodedesc[0xa0] = '\0';
  nodedesc[0xa1] = '\0';
  nodedesc[0xa2] = '\0';
  nodedesc[0xa3] = '\0';
  nodedesc[0xa4] = '\0';
  nodedesc[0xa5] = '\0';
  nodedesc[0xa6] = '\0';
  nodedesc[0xa7] = '\0';
  nodedesc[0x88] = '\0';
  nodedesc[0x89] = '\0';
  nodedesc[0x8a] = '\0';
  nodedesc[0x8b] = '\0';
  nodedesc[0x8c] = '\0';
  nodedesc[0x8d] = '\0';
  nodedesc[0x8e] = '\0';
  nodedesc[0x8f] = '\0';
  nodedesc[0x90] = '\0';
  nodedesc[0x91] = '\0';
  nodedesc[0x92] = '\0';
  nodedesc[0x93] = '\0';
  nodedesc[0x94] = '\0';
  nodedesc[0x95] = '\0';
  nodedesc[0x96] = '\0';
  nodedesc[0x97] = '\0';
  nodedesc[0x78] = '\0';
  nodedesc[0x79] = '\0';
  nodedesc[0x7a] = '\0';
  nodedesc[0x7b] = '\0';
  nodedesc[0x7c] = '\0';
  nodedesc[0x7d] = '\0';
  nodedesc[0x7e] = '\0';
  nodedesc[0x7f] = '\0';
  nodedesc[0x80] = '\0';
  nodedesc[0x81] = '\0';
  nodedesc[0x82] = '\0';
  nodedesc[0x83] = '\0';
  nodedesc[0x84] = '\0';
  nodedesc[0x85] = '\0';
  nodedesc[0x86] = '\0';
  nodedesc[0x87] = '\0';
  nodedesc[0x68] = '\0';
  nodedesc[0x69] = '\0';
  nodedesc[0x6a] = '\0';
  nodedesc[0x6b] = '\0';
  nodedesc[0x6c] = '\0';
  nodedesc[0x6d] = '\0';
  nodedesc[0x6e] = '\0';
  nodedesc[0x6f] = '\0';
  nodedesc[0x70] = '\0';
  nodedesc[0x71] = '\0';
  nodedesc[0x72] = '\0';
  nodedesc[0x73] = '\0';
  nodedesc[0x74] = '\0';
  nodedesc[0x75] = '\0';
  nodedesc[0x76] = '\0';
  nodedesc[0x77] = '\0';
  nodedesc[0x58] = '\0';
  nodedesc[0x59] = '\0';
  nodedesc[0x5a] = '\0';
  nodedesc[0x5b] = '\0';
  nodedesc[0x5c] = '\0';
  nodedesc[0x5d] = '\0';
  nodedesc[0x5e] = '\0';
  nodedesc[0x5f] = '\0';
  nodedesc[0x60] = '\0';
  nodedesc[0x61] = '\0';
  nodedesc[0x62] = '\0';
  nodedesc[99] = '\0';
  nodedesc[100] = '\0';
  nodedesc[0x65] = '\0';
  nodedesc[0x66] = '\0';
  nodedesc[0x67] = '\0';
  nodedesc[0x48] = '\0';
  nodedesc[0x49] = '\0';
  nodedesc[0x4a] = '\0';
  nodedesc[0x4b] = '\0';
  nodedesc[0x4c] = '\0';
  nodedesc[0x4d] = '\0';
  nodedesc[0x4e] = '\0';
  nodedesc[0x4f] = '\0';
  nodedesc[0x50] = '\0';
  nodedesc[0x51] = '\0';
  nodedesc[0x52] = '\0';
  nodedesc[0x53] = '\0';
  nodedesc[0x54] = '\0';
  nodedesc[0x55] = '\0';
  nodedesc[0x56] = '\0';
  nodedesc[0x57] = '\0';
  nodedesc[0x38] = '\0';
  nodedesc[0x39] = '\0';
  nodedesc[0x3a] = '\0';
  nodedesc[0x3b] = '\0';
  nodedesc[0x3c] = '\0';
  nodedesc[0x3d] = '\0';
  nodedesc[0x3e] = '\0';
  nodedesc[0x3f] = '\0';
  nodedesc[0x40] = '\0';
  nodedesc[0x41] = '\0';
  nodedesc[0x42] = '\0';
  nodedesc[0x43] = '\0';
  nodedesc[0x44] = '\0';
  nodedesc[0x45] = '\0';
  nodedesc[0x46] = '\0';
  nodedesc[0x47] = '\0';
  nodedesc[0x28] = '\0';
  nodedesc[0x29] = '\0';
  nodedesc[0x2a] = '\0';
  nodedesc[0x2b] = '\0';
  nodedesc[0x2c] = '\0';
  nodedesc[0x2d] = '\0';
  nodedesc[0x2e] = '\0';
  nodedesc[0x2f] = '\0';
  nodedesc[0x30] = '\0';
  nodedesc[0x31] = '\0';
  nodedesc[0x32] = '\0';
  nodedesc[0x33] = '\0';
  nodedesc[0x34] = '\0';
  nodedesc[0x35] = '\0';
  nodedesc[0x36] = '\0';
  nodedesc[0x37] = '\0';
  nodedesc[0x18] = '\0';
  nodedesc[0x19] = '\0';
  nodedesc[0x1a] = '\0';
  nodedesc[0x1b] = '\0';
  nodedesc[0x1c] = '\0';
  nodedesc[0x1d] = '\0';
  nodedesc[0x1e] = '\0';
  nodedesc[0x1f] = '\0';
  nodedesc[0x20] = '\0';
  nodedesc[0x21] = '\0';
  nodedesc[0x22] = '\0';
  nodedesc[0x23] = '\0';
  nodedesc[0x24] = '\0';
  nodedesc[0x25] = '\0';
  nodedesc[0x26] = '\0';
  nodedesc[0x27] = '\0';
  nodedesc[8] = '\0';
  nodedesc[9] = '\0';
  nodedesc[10] = '\0';
  nodedesc[0xb] = '\0';
  nodedesc[0xc] = '\0';
  nodedesc[0xd] = '\0';
  nodedesc[0xe] = '\0';
  nodedesc[0xf] = '\0';
  nodedesc[0x10] = '\0';
  nodedesc[0x11] = '\0';
  nodedesc[0x12] = '\0';
  nodedesc[0x13] = '\0';
  nodedesc[0x14] = '\0';
  nodedesc[0x15] = '\0';
  nodedesc[0x16] = '\0';
  nodedesc[0x17] = '\0';
  acStack_138[0] = '\0';
  acStack_138[1] = '\0';
  acStack_138[2] = '\0';
  acStack_138[3] = '\0';
  acStack_138[4] = '\0';
  acStack_138[5] = '\0';
  acStack_138[6] = '\0';
  acStack_138[7] = '\0';
  nodedesc[0] = '\0';
  nodedesc[1] = '\0';
  nodedesc[2] = '\0';
  nodedesc[3] = '\0';
  nodedesc[4] = '\0';
  nodedesc[5] = '\0';
  nodedesc[6] = '\0';
  nodedesc[7] = '\0';
  nodedesc._248_8_ = args;
  TagToString(node,acStack_138,0x100);
  if (code == 0x235) {
    level_00 = TidyWarning;
    if (doc->badForm != 0) {
      level_00 = TidyError;
    }
    doc_local = (TidyDocImpl *)prvTidytidyMessageCreateWithNode(doc,node,0x235,level_00,acStack_138)
    ;
  }
  else {
    doc_local = (TidyDocImpl *)0x0;
  }
  return (TidyMessageImpl *)doc_local;
}

Assistant:

TidyMessageImpl *formatStandardDynamic(TidyDocImpl* doc, Node *element, Node *node, uint code, uint level, va_list args)
{
    char nodedesc[ 256 ] = {0};

    TagToString(node, nodedesc, sizeof(nodedesc));

    switch (code)
    {
        case DISCARDING_UNEXPECTED:
            /* Force error if in a bad form, or Issue #166 - repeated <main> element. */
            /* Can we use `rpt` here? No; `element` has a value in every case. */
            return TY_(tidyMessageCreateWithNode)(doc, node, code, doc->badForm ? TidyError : TidyWarning, nodedesc );
            break;
    }

    return NULL;
}